

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  RepeatedPtrField<google::protobuf::Message> *pRVar1;
  bool bVar2;
  Type TVar3;
  uint32 uVar4;
  int iVar5;
  MessageLite *pMVar6;
  MapFieldBase *this_00;
  LogMessage *other;
  Descriptor *pDVar7;
  long *plVar8;
  Type *value;
  LogFinisher local_69;
  LogMessage local_68;
  undefined4 extraout_var;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddMessage",
               "Field is singular; the method requires a repeated field.");
  }
  TVar3 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"AddMessage",CPPTYPE_MESSAGE);
  }
  if (factory == (MessageFactory *)0x0) {
    factory = this->message_factory_;
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar4 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar6 = ExtensionSet::AddMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),field
                        ,factory);
    return (Message *)pMVar6;
  }
  bVar2 = FieldDescriptor::is_map(field);
  uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
  if (bVar2) {
    this_00 = (MapFieldBase *)MapFieldBase::MutableRepeatedField(this_00);
  }
  pRVar1 = this_00->repeated_field_;
  if (pRVar1 != (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    iVar5 = *(int *)&this_00->arena_;
    if (iVar5 < *(int *)&(pRVar1->super_RepeatedPtrFieldBase).arena_) {
      *(int *)&this_00->arena_ = iVar5 + 1;
      value = *(Type **)(&(pRVar1->super_RepeatedPtrFieldBase).current_size_ + (long)iVar5 * 2);
      goto LAB_0031dd6e;
    }
  }
  value = (Type *)0x0;
LAB_0031dd6e:
  if (value == (Type *)0x0) {
    if (*(int *)&this_00->arena_ == 0) {
      pDVar7 = FieldDescriptor::message_type(field);
      iVar5 = (*factory->_vptr_MessageFactory[2])(factory,pDVar7);
      plVar8 = (long *)CONCAT44(extraout_var,iVar5);
    }
    else {
      if (*(int *)&this_00->arena_ < 1) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5c6);
        other = LogMessage::operator<<(&local_68,"CHECK failed: (index) < (current_size_): ");
        LogFinisher::operator=(&local_69,other);
        LogMessage::~LogMessage(&local_68);
      }
      plVar8 = *(long **)&(this_00->repeated_field_->super_RepeatedPtrFieldBase).current_size_;
    }
    iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[5])(message);
    value = (Type *)(**(code **)(*plVar8 + 0x20))(plVar8,iVar5);
    RepeatedPtrFieldBase::
    UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              ((RepeatedPtrFieldBase *)this_00,value);
  }
  return value;
}

Assistant:

Message* GeneratedMessageReflection::AddMessage(
    Message* message, const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(AddMessage, REPEATED, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->AddMessage(field, factory));
  } else {
    Message* result = NULL;

    // We can't use AddField<Message>() because RepeatedPtrFieldBase doesn't
    // know how to allocate one.
    RepeatedPtrFieldBase* repeated = NULL;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    result = repeated->AddFromCleared<GenericTypeHandler<Message> >();
    if (result == NULL) {
      // We must allocate a new object.
      const Message* prototype;
      if (repeated->size() == 0) {
        prototype = factory->GetPrototype(field->message_type());
      } else {
        prototype = &repeated->Get<GenericTypeHandler<Message> >(0);
      }
      result = prototype->New(message->GetArena());
      // We can guarantee here that repeated and result are either both heap
      // allocated or arena owned. So it is safe to call the unsafe version
      // of AddAllocated.
      repeated->UnsafeArenaAddAllocated<GenericTypeHandler<Message> >(result);
    }

    return result;
  }
}